

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementForm.cpp
# Opt level: O0

void __thiscall Rml::ElementForm::Submit(ElementForm *this,String *name,String *submit_value)

{
  pointer t;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  type pVVar4;
  ElementFormControl *pEVar5;
  reference ppEVar6;
  Variant *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  Variant *local_138;
  Variant *value;
  undefined1 local_128 [8];
  String control_value;
  String control_name;
  ElementFormControl *control;
  size_t i;
  String local_d0;
  allocator<char> local_a9;
  String local_a8;
  allocator<char> local_81;
  String local_80;
  undefined1 local_60 [8];
  ElementList form_controls;
  undefined1 local_38 [8];
  Dictionary values;
  String *submit_value_local;
  String *name_local;
  ElementForm *this_local;
  
  values.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)submit_value;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
              *)local_38);
  uVar3 = ::std::__cxx11::string::empty();
  t = values.m_container.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((uVar3 & 1) == 0) {
    pVVar4 = itlib::
             flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
             ::operator[]<std::__cxx11::string_const&>
                       ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                         *)local_38,name);
    Variant::operator=(pVVar4,&t->first);
  }
  else {
    pVVar4 = itlib::
             flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
             ::operator[]<char_const(&)[7]>
                       ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                         *)local_38,(char (*) [7])"submit");
    Variant::operator=(pVVar4,&t->first);
  }
  ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::vector
            ((vector<Rml::Element_*,_std::allocator<Rml::Element_*>_> *)local_60);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"input",&local_81);
  ElementUtilities::GetElementsByTagName((ElementList *)local_60,&this->super_Element,&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::allocator<char>::~allocator(&local_81);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"textarea",&local_a9);
  ElementUtilities::GetElementsByTagName((ElementList *)local_60,&this->super_Element,&local_a8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::allocator<char>::~allocator(&local_a9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"select",(allocator<char> *)((long)&i + 7));
  ElementUtilities::GetElementsByTagName((ElementList *)local_60,&this->super_Element,&local_d0);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  for (control = (ElementFormControl *)0x0;
      pEVar5 = (ElementFormControl *)
               ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::size
                         ((vector<Rml::Element_*,_std::allocator<Rml::Element_*>_> *)local_60),
      control < pEVar5;
      control = (ElementFormControl *)
                ((long)&(control->super_Element).super_ScriptInterface.super_Releasable.
                        _vptr_Releasable + 1)) {
    ppEVar6 = ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::operator[]
                        ((vector<Rml::Element_*,_std::allocator<Rml::Element_*>_> *)local_60,
                         (size_type)control);
    pEVar5 = rmlui_dynamic_cast<Rml::ElementFormControl*,Rml::Element*>(*ppEVar6);
    if (((pEVar5 != (ElementFormControl *)0x0) &&
        (bVar1 = ElementFormControl::IsDisabled(pEVar5), !bVar1)) &&
       (uVar2 = (*(pEVar5->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable
                  [0x1a])(), (uVar2 & 1) != 0)) {
      ElementFormControl::GetName_abi_cxx11_((String *)((long)&control_value.field_2 + 8),pEVar5);
      (*(pEVar5->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable[0x18])
                (local_128);
      uVar3 = ::std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        this_00 = GetIf((Dictionary *)local_38,(String *)((long)&control_value.field_2 + 8));
        local_138 = this_00;
        if (this_00 == (Variant *)0x0) {
          pVVar4 = itlib::
                   flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                   ::operator[]<std::__cxx11::string&>
                             ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                               *)local_38,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&control_value.field_2 + 8));
          Variant::operator=(pVVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_128);
        }
        else {
          ::std::__cxx11::string::string((string *)&local_1b8);
          Variant::Get<std::__cxx11::string>(&local_198,this_00,&local_1b8);
          ::std::operator+(&local_178,&local_198,", ");
          ::std::operator+(&local_158,&local_178,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_128);
          Variant::operator=(local_138,&local_158);
          ::std::__cxx11::string::~string((string *)&local_158);
          ::std::__cxx11::string::~string((string *)&local_178);
          ::std::__cxx11::string::~string((string *)&local_198);
          ::std::__cxx11::string::~string((string *)&local_1b8);
        }
        value._4_4_ = 0;
      }
      else {
        value._4_4_ = 4;
      }
      ::std::__cxx11::string::~string((string *)local_128);
      ::std::__cxx11::string::~string((string *)(control_value.field_2._M_local_buf + 8));
    }
  }
  Element::DispatchEvent(&this->super_Element,Submit,(Dictionary *)local_38);
  ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::~vector
            ((vector<Rml::Element_*,_std::allocator<Rml::Element_*>_> *)local_60);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
               *)local_38);
  return;
}

Assistant:

void ElementForm::Submit(const String& name, const String& submit_value)
{
	Dictionary values;
	if (name.empty())
		values["submit"] = submit_value;
	else
		values[name] = submit_value;

	ElementList form_controls;
	ElementUtilities::GetElementsByTagName(form_controls, this, "input");
	ElementUtilities::GetElementsByTagName(form_controls, this, "textarea");
	ElementUtilities::GetElementsByTagName(form_controls, this, "select");

	for (size_t i = 0; i < form_controls.size(); i++)
	{
		ElementFormControl* control = rmlui_dynamic_cast<ElementFormControl*>(form_controls[i]);
		if (!control)
			continue;

		// Skip disabled controls.
		if (control->IsDisabled())
			continue;

		// Only process controls that should be submitted.
		if (!control->IsSubmitted())
			continue;

		String control_name = control->GetName();
		String control_value = control->GetValue();

		// Skip over unnamed form controls.
		if (control_name.empty())
			continue;

		// If the item already exists, append to it.
		Variant* value = GetIf(values, control_name);
		if (value != nullptr)
			*value = value->Get<String>() + ", " + control_value;
		else
			values[control_name] = control_value;
	}

	DispatchEvent(EventId::Submit, values);
}